

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O0

void __thiscall
PlantUmlGenerator::transitionLink
          (PlantUmlGenerator *this,ostream *output,string *indent,bool isTransitionHighlighted,
          ScName *stateAliasOrigin,ScName *stateAliasTarget,ScNameSet *eventNames)

{
  bool bVar1;
  ostream *poVar2;
  reference pbVar3;
  ulong uVar4;
  ScName local_c0;
  ScName local_a0;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> eventName;
  iterator __end1;
  iterator __begin1;
  ScNameSet *__range1;
  ScName *stateAliasTarget_local;
  ScName *stateAliasOrigin_local;
  bool isTransitionHighlighted_local;
  string *indent_local;
  ostream *output_local;
  PlantUmlGenerator *this_local;
  
  if (isTransitionHighlighted) {
    poVar2 = std::operator<<(output,(string *)indent);
    poVar2 = std::operator<<(poVar2,(string *)stateAliasOrigin);
    poVar2 = std::operator<<(poVar2,"-[#red,bold]-->");
    poVar2 = std::operator<<(poVar2,(string *)stateAliasTarget);
    std::operator<<(poVar2," : ");
  }
  else {
    poVar2 = std::operator<<(output,(string *)indent);
    poVar2 = std::operator<<(poVar2,(string *)stateAliasOrigin);
    poVar2 = std::operator<<(poVar2,"-->");
    poVar2 = std::operator<<(poVar2,(string *)stateAliasTarget);
    std::operator<<(poVar2," : ");
  }
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(eventNames);
  eventName.field_2._8_8_ =
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(eventNames);
  while (bVar1 = std::operator!=(&__end1,(_Self *)((long)&eventName.field_2 + 8)), bVar1) {
    pbVar3 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_70,(string *)pbVar3);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      std::__cxx11::string::operator=((string *)local_70,"<unknown>");
    }
    bVar1 = ::AbstractGenerator::isHighlighted(&this->super_AbstractGenerator,(ScName *)local_70);
    if (bVar1) {
      poVar2 = std::operator<<(output,"<b>");
      removeNamespaces(&local_a0,(ScName *)local_70);
      poVar2 = std::operator<<(poVar2,(string *)&local_a0);
      std::operator<<(poVar2,"</b>\\n");
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      removeNamespaces(&local_c0,(ScName *)local_70);
      poVar2 = std::operator<<(output,(string *)&local_c0);
      std::operator<<(poVar2,"\\n");
      std::__cxx11::string::~string((string *)&local_c0);
    }
    std::__cxx11::string::~string((string *)local_70);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::operator<<(output,"\n");
  return;
}

Assistant:

void PlantUmlGenerator::transitionLink(std::ostream &output, std::string &indent,
                                       bool isTransitionHighlighted, const ScName &stateAliasOrigin,
                                       const ScName &stateAliasTarget, const ScNameSet &eventNames)
{

    if (isTransitionHighlighted) {
        output << indent << stateAliasOrigin << "-[#red,bold]-->" << stateAliasTarget << " : ";
    } else {
        output << indent << stateAliasOrigin << "-->" << stateAliasTarget << " : ";
    }

    for (auto eventName : eventNames) {
        if (eventName.empty()) {
            eventName = "<unknown>";
        }

        if (isHighlighted(eventName)) {
            output << "<b>" << removeNamespaces(eventName) << "</b>\\n";
        } else {
            output << removeNamespaces(eventName) << "\\n";
        }
    }

    output << "\n";
}